

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_font_cid.c
# Opt level: O0

char * UINT16ToHex(char *s,HPDF_UINT16 val,char *eptr,HPDF_BYTE width)

{
  char *pcVar1;
  byte bVar2;
  char local_2f;
  HPDF_BYTE local_2e [3];
  byte local_2b;
  byte local_2a;
  HPDF_BYTE local_29;
  char c;
  HPDF_UINT16 val2;
  HPDF_BYTE b [2];
  char *pcStack_28;
  HPDF_BYTE width_local;
  char *eptr_local;
  char *pcStack_18;
  HPDF_UINT16 val_local;
  char *s_local;
  
  s_local = s;
  if (6 < (long)eptr - (long)s) {
    local_29 = width;
    pcStack_28 = eptr;
    eptr_local._6_2_ = val;
    pcStack_18 = s;
    HPDF_MemCpy(&local_2b,(HPDF_BYTE *)((long)&eptr_local + 6),2);
    HPDF_MemCpy(&local_2b,local_2e,2);
    *pcStack_18 = '<';
    pcVar1 = pcStack_18 + 1;
    if (local_29 == '\x02') {
      bVar2 = (byte)((int)(uint)local_2b >> 4);
      if (bVar2 < 10) {
        local_2f = bVar2 + 0x30;
      }
      else {
        local_2f = bVar2 + 0x37;
      }
      pcStack_18[1] = local_2f;
      local_2b = local_2b & 0xf;
      if (local_2b < 10) {
        local_2f = local_2b + 0x30;
      }
      else {
        local_2f = local_2b + 0x37;
      }
      pcStack_18[2] = local_2f;
      pcVar1 = pcStack_18 + 3;
    }
    pcStack_18 = pcVar1;
    bVar2 = (byte)((int)(uint)local_2a >> 4);
    if (bVar2 < 10) {
      local_2f = bVar2 + 0x30;
    }
    else {
      local_2f = bVar2 + 0x37;
    }
    *pcStack_18 = local_2f;
    local_2a = local_2a & 0xf;
    if (local_2a < 10) {
      local_2f = local_2a + 0x30;
    }
    else {
      local_2f = local_2a + 0x37;
    }
    pcStack_18[1] = local_2f;
    s_local = pcStack_18 + 3;
    pcStack_18[2] = '>';
    *s_local = '\0';
  }
  return s_local;
}

Assistant:

static char*
UINT16ToHex  (char        *s,
              HPDF_UINT16  val,
              char        *eptr,
              HPDF_BYTE    width)
{
    HPDF_BYTE b[2];
    HPDF_UINT16 val2;
    char c;

    if (eptr - s < 7)
        return s;

    /* align byte-order */
    HPDF_MemCpy (b, (HPDF_BYTE *)&val, 2);
    val2 = (HPDF_UINT16)((HPDF_UINT16)b[0] << 8 | (HPDF_UINT16)b[1]);

    HPDF_MemCpy (b, (HPDF_BYTE *)&val2, 2);

    *s++ = '<';

    /*
     * In principle a range of <00> - <1F> can now not be
     * distinguished from <0000> - <001F>..., this seems something
     * that is wrong with CID ranges. For the UCS-2 encoding we need
     * to add <0000> - <FFFF> and this cannot be <00> - <FFFF> (or at
     * least, that crashes Mac OSX Preview).
     */
    if (width == 2) {
        c = b[0] >> 4;
        if (c <= 9)
            c += 0x30;
        else
            c += 0x41 - 10;
        *s++ = c;

        c = (char)(b[0] & 0x0f);
        if (c <= 9)
            c += 0x30;
        else
            c += 0x41 - 10;
        *s++ = c;
    }

    c = (char)(b[1] >> 4);
    if (c <= 9)
        c += 0x30;
    else
        c += 0x41 - 10;
    *s++ = c;

    c = (char)(b[1] & 0x0f);
    if (c <= 9)
        c += 0x30;
    else
        c += 0x41 - 10;
    *s++ = c;

    *s++ = '>';
    *s = 0;

    return s;
}